

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

void __thiscall cppforth::Forth::exceptionsCatchBefore(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  
  this_00 = &this->catchStack;
  ForthStack<unsigned_int>::push(this_00,(this->dStack).top - 1);
  ForthStack<unsigned_int>::push(this_00,(this->rStack).top);
  ForthStack<unsigned_int>::push(this_00,(this->returnStack).top);
  ForthStack<unsigned_int>::push
            (this_00,(int)((ulong)((long)(this->savedInput).
                                         super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this->savedInput).
                                        super__Vector_base<cppforth::Forth::structSavedInput,_std::allocator<cppforth::Forth::structSavedInput>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x33333333);
  ForthStack<unsigned_int>::push(this_00,this->exceptionHandler);
  this->exceptionHandler = (this->catchStack).top;
  return;
}

Assistant:

void exceptionsCatchBefore(){
			catchStack.push(static_cast<Cell>(dStack.stackDepth()-1));
			catchStack.push(static_cast<Cell>(rStack.stackDepth()));
			catchStack.push(static_cast<Cell>(returnStack.stackDepth()));
			catchStack.push(CELL(savedInput.size()));
			catchStack.push(exceptionHandler);
			exceptionHandler = static_cast<Cell>(catchStack.stackDepth());
		}